

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBinaryCEscape
          (EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
          ArrayPtr<const_char> text,bool nulTerminate)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  NullableValue<unsigned_int> *pNVar5;
  uint *puVar6;
  bool bVar7;
  ArrayPtr<char16_t> AVar8;
  ArrayPtr<const_char16_t> utf16;
  ArrayPtr<unsigned_char> AVar9;
  ArrayPtr<char32_t> AVar10;
  ArrayPtr<const_char32_t> utf16_00;
  Array<unsigned_char> local_1b0;
  int local_194;
  ArrayPtr<unsigned_char> local_190;
  ArrayPtr<char32_t> local_180;
  ArrayPtr<const_char32_t> local_170;
  undefined1 local_160 [8];
  EncodingResult<kj::String> utf_1;
  uint *d_3;
  NullableValue<unsigned_int> local_130;
  NullableValue<unsigned_int> _d668;
  uint j_2;
  char32_t value_3;
  size_t local_118;
  ArrayPtr<char16_t> local_110;
  ArrayPtr<const_char16_t> local_100;
  undefined1 local_f0 [8];
  EncodingResult<kj::String> utf;
  uint *d_2;
  NullableValue<unsigned_int> local_c0;
  NullableValue<unsigned_int> _d648;
  uint j_1;
  char16_t value_2;
  uint *d_1;
  NullableValue<unsigned_int> local_a0;
  NullableValue<unsigned_int> _d630;
  uint value_1;
  uint *d;
  NullableValue<unsigned_int> local_80;
  NullableValue<unsigned_int> _d615;
  uint j;
  uint value;
  char local_68 [3];
  char local_65 [7];
  char c2;
  char c;
  ulong local_58;
  size_t i;
  undefined1 local_48 [7];
  bool hadErrors;
  Vector<unsigned_char> result;
  undefined1 auStack_20 [7];
  bool nulTerminate_local;
  ArrayPtr<const_char> text_local;
  
  text_local.ptr = text.ptr;
  result.builder.disposer._7_1_ = (byte)text.size_ & 1;
  _auStack_20 = this;
  text_local.size_ = (size_t)__return_storage_ptr__;
  sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
  Vector<unsigned_char>::Vector
            ((Vector<unsigned_char> *)local_48,sVar3 + (result.builder.disposer._7_1_ & 1));
  i._7_1_ = 0;
  local_58 = 0;
  do {
    while( true ) {
      while( true ) {
        uVar1 = local_58;
        sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
        uVar2 = local_58;
        if (sVar3 <= uVar1) {
          if ((result.builder.disposer._7_1_ & 1) != 0) {
            local_194 = 0;
            Vector<unsigned_char>::add<int>((Vector<unsigned_char> *)local_48,&local_194);
          }
          Vector<unsigned_char>::releaseAsArray(&local_1b0,(Vector<unsigned_char> *)local_48);
          EncodingResult<kj::Array<unsigned_char>_>::EncodingResult
                    (__return_storage_ptr__,&local_1b0,(bool)(i._7_1_ & 1));
          Array<unsigned_char>::~Array(&local_1b0);
          _d630.field_1.value = 1;
          Vector<unsigned_char>::~Vector((Vector<unsigned_char> *)local_48);
          return __return_storage_ptr__;
        }
        local_58 = local_58 + 1;
        pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)auStack_20,uVar2);
        uVar1 = local_58;
        local_65[0] = *pcVar4;
        if (local_65[0] == '\\') break;
        Vector<unsigned_char>::add<char&>((Vector<unsigned_char> *)local_48,local_65);
      }
      sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
      uVar2 = local_58;
      if (uVar1 != sVar3) break;
      i._7_1_ = 1;
    }
    local_58 = local_58 + 1;
    pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)auStack_20,uVar2);
    local_68[2] = *pcVar4;
    switch(local_68[2]) {
    case '\"':
      j._1_1_ = 0x22;
      Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,(char *)((long)&j + 1));
      break;
    default:
      Vector<unsigned_char>::add<char&>((Vector<unsigned_char> *)local_48,local_68 + 2);
      break;
    case '\'':
      j._2_1_ = 0x27;
      Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,(char *)((long)&j + 2));
      break;
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
      _d615.field_1.value = (int)local_68[2] - 0x30;
      _d615.isSet = false;
      _d615._1_3_ = 0;
      while( true ) {
        uVar1 = local_58;
        bVar7 = false;
        if ((uint)_d615._0_4_ < 2) {
          sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
          bVar7 = uVar1 < sVar3;
        }
        if (!bVar7) break;
        pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)auStack_20,local_58);
        anon_unknown_0::tryFromOctDigit((anon_unknown_0 *)&d,*pcVar4);
        pNVar5 = _::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&d);
        _::NullableValue<unsigned_int>::NullableValue(&local_80,pNVar5);
        Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&d);
        puVar6 = _::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_80);
        if (puVar6 == (uint *)0x0) {
          _d630.field_1.value = 5;
        }
        else {
          puVar6 = _::NullableValue<unsigned_int>::operator*(&local_80);
          local_58 = local_58 + 1;
          _d615.field_1.value = _d615.field_1.value << 3 | *puVar6;
          _d630.field_1.value = 0;
        }
        _::NullableValue<unsigned_int>::~NullableValue(&local_80);
        if (_d630.field_1.value != 0) break;
        _d615._0_4_ = _d615._0_4_ + 1;
      }
      if (0xff < _d615.field_1.value) {
        i._7_1_ = 1;
      }
      Vector<unsigned_char>::add<unsigned_int&>
                ((Vector<unsigned_char> *)local_48,&_d615.field_1.value);
      break;
    case 'U':
      _d668.field_1.value = 0;
      _d668.isSet = false;
      _d668._1_3_ = 0;
      for (; uVar1 = local_58, (uint)_d668._0_4_ < 8; _d668._0_4_ = _d668._0_4_ + 1) {
        sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
        if (uVar1 == sVar3) {
          i._7_1_ = 1;
          break;
        }
        pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)auStack_20,local_58);
        anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&d_3,*pcVar4);
        pNVar5 = _::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&d_3);
        _::NullableValue<unsigned_int>::NullableValue(&local_130,pNVar5);
        Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&d_3);
        puVar6 = _::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_130);
        if (puVar6 == (uint *)0x0) {
          i._7_1_ = 1;
          _d630.field_1.value = 0xd;
        }
        else {
          utf_1._24_8_ = _::NullableValue<unsigned_int>::operator*(&local_130);
          local_58 = local_58 + 1;
          _d668.field_1.value = _d668.field_1.value << 4 | *(uint *)utf_1._24_8_;
          _d630.field_1.value = 0;
        }
        _::NullableValue<unsigned_int>::~NullableValue(&local_130);
        if (_d630.field_1.value != 0) break;
      }
      AVar10 = arrayPtr<char32_t>((char32_t *)&_d668.field_1.value,1);
      local_180 = AVar10;
      utf16_00 = ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_180);
      local_170 = utf16_00;
      decodeUtf32((EncodingResult<kj::String> *)local_160,utf16_00);
      if (((byte)utf_1.super_String.content.disposer & 1) != 0) {
        i._7_1_ = 1;
      }
      AVar9 = String::asBytes((String *)local_160);
      local_190 = AVar9;
      Vector<unsigned_char>::addAll<kj::ArrayPtr<unsigned_char>>
                ((Vector<unsigned_char> *)local_48,&local_190);
      _d630.field_1.value = 4;
      EncodingResult<kj::String>::~EncodingResult((EncodingResult<kj::String> *)local_160);
      break;
    case '\\':
      j._0_1_ = 0x5c;
      Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,(char *)&j);
      break;
    case 'a':
      local_68[1] = 7;
      Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,local_68 + 1);
      break;
    case 'b':
      local_68[0] = '\b';
      Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,local_68);
      break;
    case 'f':
      value._3_1_ = 0xc;
      Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,(char *)((long)&value + 3))
      ;
      break;
    case 'n':
      value._2_1_ = 10;
      Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,(char *)((long)&value + 2))
      ;
      break;
    case 'r':
      value._1_1_ = 0xd;
      Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,(char *)((long)&value + 1))
      ;
      break;
    case 't':
      value._0_1_ = 9;
      Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,(char *)&value);
      break;
    case 'u':
      _d648.field_1.value._2_2_ = 0;
      _d648.isSet = false;
      _d648._1_3_ = 0;
      for (; uVar1 = local_58, (uint)_d648._0_4_ < 4; _d648._0_4_ = _d648._0_4_ + 1) {
        sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
        if (uVar1 == sVar3) {
          i._7_1_ = 1;
          break;
        }
        pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)auStack_20,local_58);
        anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&d_2,*pcVar4);
        pNVar5 = _::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&d_2);
        _::NullableValue<unsigned_int>::NullableValue(&local_c0,pNVar5);
        Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&d_2);
        puVar6 = _::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_c0);
        if (puVar6 == (uint *)0x0) {
          i._7_1_ = 1;
          _d630.field_1.value = 10;
        }
        else {
          utf._24_8_ = _::NullableValue<unsigned_int>::operator*(&local_c0);
          local_58 = local_58 + 1;
          _d648.field_1.value._2_2_ = _d648.field_1.value._2_2_ << 4 | (ushort)*(uint *)utf._24_8_;
          _d630.field_1.value = 0;
        }
        _::NullableValue<unsigned_int>::~NullableValue(&local_c0);
        if (_d630.field_1.value != 0) break;
      }
      AVar8 = arrayPtr<char16_t>((char16_t *)((long)&_d648.field_1 + 2),1);
      local_110 = AVar8;
      utf16 = ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_110);
      local_100 = utf16;
      decodeUtf16((EncodingResult<kj::String> *)local_f0,utf16);
      if (((byte)utf.super_String.content.disposer & 1) != 0) {
        i._7_1_ = 1;
      }
      AVar9 = String::asBytes((String *)local_f0);
      _j_2 = AVar9;
      Vector<unsigned_char>::addAll<kj::ArrayPtr<unsigned_char>>
                ((Vector<unsigned_char> *)local_48,(ArrayPtr<unsigned_char> *)&j_2);
      _d630.field_1.value = 4;
      EncodingResult<kj::String>::~EncodingResult((EncodingResult<kj::String> *)local_f0);
      break;
    case 'v':
      j._3_1_ = 0xb;
      Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,(char *)((long)&j + 3));
      break;
    case 'x':
      _d630.isSet = false;
      _d630._1_3_ = 0;
      do {
        uVar1 = local_58;
        sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
        if (sVar3 <= uVar1) break;
        pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)auStack_20,local_58);
        anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&d_1,*pcVar4);
        pNVar5 = _::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&d_1);
        _::NullableValue<unsigned_int>::NullableValue(&local_a0,pNVar5);
        Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&d_1);
        puVar6 = _::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_a0);
        if (puVar6 == (uint *)0x0) {
          _d630.field_1.value = 9;
        }
        else {
          puVar6 = _::NullableValue<unsigned_int>::operator*(&local_a0);
          local_58 = local_58 + 1;
          _d630._0_4_ = _d630._0_4_ << 4 | *puVar6;
          _d630.field_1.value = 0;
        }
        _::NullableValue<unsigned_int>::~NullableValue(&local_a0);
      } while (_d630.field_1.value == 0);
      if (0xff < (uint)_d630._0_4_) {
        i._7_1_ = 1;
      }
      Vector<unsigned_char>::add<unsigned_int&>((Vector<unsigned_char> *)local_48,(uint *)&_d630);
    }
  } while( true );
}

Assistant:

EncodingResult<Array<byte>> decodeBinaryCEscape(ArrayPtr<const char> text, bool nulTerminate) {
  Vector<byte> result(text.size() + nulTerminate);
  bool hadErrors = false;

  size_t i = 0;
  while (i < text.size()) {
    char c = text[i++];
    if (c == '\\') {
      if (i == text.size()) {
        hadErrors = true;
        continue;
      }
      char c2 = text[i++];
      switch (c2) {
        case 'a' : result.add('\a'); break;
        case 'b' : result.add('\b'); break;
        case 'f' : result.add('\f'); break;
        case 'n' : result.add('\n'); break;
        case 'r' : result.add('\r'); break;
        case 't' : result.add('\t'); break;
        case 'v' : result.add('\v'); break;
        case '\'': result.add('\''); break;
        case '\"': result.add('\"'); break;
        case '\\': result.add('\\'); break;

        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7': {
          uint value = c2 - '0';
          for (uint j = 0; j < 2 && i < text.size(); j++) {
            KJ_IF_SOME(d, tryFromOctDigit(text[i])) {
              ++i;
              value = (value << 3) | d;
            } else {
              break;
            }
          }
          if (value >= 0x100) hadErrors = true;
          result.add(value);
          break;
        }

        case 'x': {
          uint value = 0;
          while (i < text.size()) {
            KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              break;
            }
          }
          if (value >= 0x100) hadErrors = true;
          result.add(value);
          break;
        }

        case 'u': {
          char16_t value = 0;
          for (uint j = 0; j < 4; j++) {
            if (i == text.size()) {
              hadErrors = true;
              break;
            } else KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              hadErrors = true;
              break;
            }
          }
          auto utf = decodeUtf16(arrayPtr(&value, 1));
          if (utf.hadErrors) hadErrors = true;
          result.addAll(utf.asBytes());
          break;
        }

        case 'U': {
          char32_t value = 0;
          for (uint j = 0; j < 8; j++) {
            if (i == text.size()) {
              hadErrors = true;
              break;
            } else KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              hadErrors = true;
              break;
            }
          }
          auto utf = decodeUtf32(arrayPtr(&value, 1));
          if (utf.hadErrors) hadErrors = true;
          result.addAll(utf.asBytes());
          break;
        }